

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlCtxtDumpEntityCallback(void *payload,void *data,xmlChar *name)

{
  uint uVar1;
  FILE *__s;
  size_t __size;
  char *__ptr;
  
  if (payload == (void *)0x0) {
    if (*(int *)((long)data + 0x90) != 0) {
      return;
    }
    fwrite("Entity is NULL",0xe,1,*data);
    return;
  }
  if (*(int *)((long)data + 0x90) != 0) {
    return;
  }
  fprintf(*data,"%s : ",*(undefined8 *)((long)payload + 0x10));
  uVar1 = *(uint *)((long)payload + 0x5c);
  switch(uVar1) {
  case 1:
    __s = *data;
    __ptr = "INTERNAL GENERAL, ";
    __size = 0x12;
    break;
  case 2:
    __s = *data;
    __ptr = "EXTERNAL PARSED, ";
    __size = 0x11;
    break;
  case 3:
    __s = *data;
    __ptr = "EXTERNAL UNPARSED, ";
    __size = 0x13;
    break;
  case 4:
    __s = *data;
    __ptr = "INTERNAL PARAMETER, ";
    goto LAB_00165ce0;
  case 5:
    __s = *data;
    __ptr = "EXTERNAL PARAMETER, ";
LAB_00165ce0:
    __size = 0x14;
    break;
  default:
    *(int *)((long)data + 0x94) = *(int *)((long)data + 0x94) + 1;
    fprintf(*data,"ERROR %d: ",0x1394);
    fprintf(*data,"Unknown entity type %d\n",(ulong)uVar1);
    goto LAB_00165d00;
  }
  fwrite(__ptr,__size,1,__s);
LAB_00165d00:
  if (*(long *)((long)payload + 0x60) != 0) {
    fprintf(*data,"ID \"%s\"");
  }
  if (*(long *)((long)payload + 0x68) != 0) {
    fprintf(*data,"SYSTEM \"%s\"");
  }
  if (*(long *)((long)payload + 0x48) != 0) {
    fprintf(*data,"\n orig \"%s\"");
  }
  if ((*(int *)((long)payload + 8) != 1) && (*(long *)((long)payload + 0x50) != 0)) {
    fprintf(*data,"\n content \"%s\"");
  }
  fputc(10,*data);
  return;
}

Assistant:

static void
xmlCtxtDumpEntityCallback(void *payload, void *data,
                          const xmlChar *name ATTRIBUTE_UNUSED)
{
    xmlEntityPtr cur = (xmlEntityPtr) payload;
    xmlDebugCtxtPtr ctxt = (xmlDebugCtxtPtr) data;
    if (cur == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "Entity is NULL");
        return;
    }
    if (!ctxt->check) {
        fprintf(ctxt->output, "%s : ", (char *) cur->name);
        switch (cur->etype) {
            case XML_INTERNAL_GENERAL_ENTITY:
                fprintf(ctxt->output, "INTERNAL GENERAL, ");
                break;
            case XML_EXTERNAL_GENERAL_PARSED_ENTITY:
                fprintf(ctxt->output, "EXTERNAL PARSED, ");
                break;
            case XML_EXTERNAL_GENERAL_UNPARSED_ENTITY:
                fprintf(ctxt->output, "EXTERNAL UNPARSED, ");
                break;
            case XML_INTERNAL_PARAMETER_ENTITY:
                fprintf(ctxt->output, "INTERNAL PARAMETER, ");
                break;
            case XML_EXTERNAL_PARAMETER_ENTITY:
                fprintf(ctxt->output, "EXTERNAL PARAMETER, ");
                break;
            default:
		xmlDebugErr2(ctxt, XML_CHECK_ENTITY_TYPE,
			     "Unknown entity type %d\n", cur->etype);
        }
        if (cur->ExternalID != NULL)
            fprintf(ctxt->output, "ID \"%s\"", (char *) cur->ExternalID);
        if (cur->SystemID != NULL)
            fprintf(ctxt->output, "SYSTEM \"%s\"", (char *) cur->SystemID);
        if (cur->orig != NULL)
            fprintf(ctxt->output, "\n orig \"%s\"", (char *) cur->orig);
        if ((cur->type != XML_ELEMENT_NODE) && (cur->content != NULL))
            fprintf(ctxt->output, "\n content \"%s\"",
                    (char *) cur->content);
        fprintf(ctxt->output, "\n");
    }
}